

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Tag_*> * __thiscall
wasm::WATParser::ParseDeclsCtx::addTagDecl
          (Result<wasm::Tag_*> *__return_storage_ptr__,ParseDeclsCtx *this,Index pos,Name name,
          ImportNames *importNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var4;
  Tag *pTVar5;
  long *plVar6;
  uint uVar7;
  char *pcVar8;
  ulong *puVar9;
  ulong uVar10;
  ImportNames *pIVar11;
  uint __len;
  Result<wasm::Tag_*> *pRVar12;
  string_view sVar13;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  ImportNames *local_70;
  ParseDeclsCtx *local_68;
  Err local_60;
  Result<wasm::Tag_*> *local_40;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  
  local_70 = importNames;
  local_40 = __return_storage_ptr__;
  _Var4._M_head_impl = (Tag *)operator_new(0x40);
  ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&((_Var4._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
  ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
  ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  ((_Var4._M_head_impl)->type).id = 0x10;
  local_38._M_head_impl = _Var4._M_head_impl;
  if (name.super_IString.str._M_str == (char *)0x0) {
    uVar2 = this->tagCounter;
    this->tagCounter = uVar2 + 1;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar10 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00b7ad37;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00b7ad37;
        }
        if (uVar7 < 10000) goto LAB_00b7ad37;
        uVar10 = uVar10 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00b7ad37:
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct((ulong)local_90,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_90[0]),__len,__val);
    pIVar11 = local_70;
    pcVar8 = "eimport$";
    if (local_70 == (ImportNames *)0x0) {
      pcVar8 = "tag$";
    }
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,(ulong)pcVar8);
    paVar1 = &local_60.msg.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_60.msg.field_2._M_allocated_capacity = *puVar9;
      local_60.msg.field_2._8_8_ = plVar6[3];
      local_60.msg._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60.msg.field_2._M_allocated_capacity = *puVar9;
      local_60.msg._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_60.msg._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    sVar13._M_str = (char *)0x0;
    sVar13._M_len = (size_t)local_60.msg._M_dataplus._M_p;
    sVar13 = IString::interned((IString *)local_60.msg._M_string_length,sVar13,SUB81(puVar9,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.msg._M_dataplus._M_p,local_60.msg.field_2._M_allocated_capacity + 1);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    sVar13 = (string_view)Names::getValidTagName(this->wasm,(Name)sVar13);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar13;
    _Var4._M_head_impl = local_38._M_head_impl;
  }
  else {
    local_68 = this;
    pTVar5 = Module::getTagOrNull(this->wasm,name);
    if (pTVar5 != (Tag *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"repeated tag name","");
      Lexer::err(&local_60,&local_68->in,(ulong)pos,&local_b0);
      pRVar12 = local_40;
      puVar9 = (ulong *)((long)&(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
                                super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x10);
      *(ulong **)
       &(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = puVar9;
      paVar1 = &local_60.msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.msg._M_dataplus._M_p == paVar1) {
        *puVar9 = local_60.msg.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x18) =
             local_60.msg.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
          super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
          super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
          super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = local_60.msg._M_dataplus._M_p;
        *(size_type *)
         ((long)&(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
                 super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x10) =
             local_60.msg.field_2._M_allocated_capacity;
      }
      *(size_type *)
       ((long)&(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 8) =
           local_60.msg._M_string_length;
      local_60.msg._M_string_length = 0;
      local_60.msg.field_2._M_allocated_capacity =
           local_60.msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(local_40->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
               super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
               super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
               super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x20) = '\x01';
      local_60.msg._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00b7ae7e;
    }
    ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         name.super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         name.super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
    this = local_68;
    pIVar11 = local_70;
  }
  pRVar12 = local_40;
  if (pIVar11 != (ImportNames *)0x0) {
    pcVar8 = (pIVar11->mod).super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         (pIVar11->mod).super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar8;
    pcVar8 = (pIVar11->nm).super_IString.str._M_str;
    ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         (pIVar11->nm).super_IString.str._M_len;
    ((_Var4._M_head_impl)->super_Importable).base.super_IString.str._M_str = pcVar8;
  }
  pTVar5 = Module::addTag(this->wasm,
                          (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
  *(Tag **)&(pRVar12->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
            super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
            super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
            super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> = pTVar5;
  *(__index_type *)
   ((long)&(pRVar12->val).super__Variant_base<wasm::Tag_*,_wasm::Err>.
           super__Move_assign_alias<wasm::Tag_*,_wasm::Err>.
           super__Copy_assign_alias<wasm::Tag_*,_wasm::Err>.
           super__Move_ctor_alias<wasm::Tag_*,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Tag_*,_wasm::Err>.
           super__Variant_storage_alias<wasm::Tag_*,_wasm::Err> + 0x20) = '\0';
  _Var4._M_head_impl = local_38._M_head_impl;
  if (local_38._M_head_impl == (Tag *)0x0) {
    return pRVar12;
  }
LAB_00b7ae7e:
  operator_delete(_Var4._M_head_impl,0x40);
  return pRVar12;
}

Assistant:

Result<Tag*>
ParseDeclsCtx::addTagDecl(Index pos, Name name, ImportNames* importNames) {
  auto t = std::make_unique<Tag>();
  if (name) {
    if (wasm.getTagOrNull(name)) {
      // TODO: if the existing tag is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated tag name");
    }
    t->setExplicitName(name);
  } else {
    name = (importNames ? "eimport$" : "tag$") + std::to_string(tagCounter++);
    name = Names::getValidTagName(wasm, name);
    t->name = name;
  }
  applyImportNames(*t, importNames);
  return wasm.addTag(std::move(t));
}